

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_get_time(uchar **p,uchar *end,mbedtls_x509_time *time)

{
  char *pcVar1;
  ulong uStack_38;
  uchar tag;
  size_t len;
  mbedtls_x509_time *pmStack_28;
  int ret;
  mbedtls_x509_time *time_local;
  uchar *end_local;
  uchar **p_local;
  
  if ((long)end - (long)*p < 1) {
    p_local._4_4_ = -0x2460;
  }
  else {
    pmStack_28 = time;
    time_local = (mbedtls_x509_time *)end;
    end_local = (uchar *)p;
    if (**p == '\x17') {
      *p = *p + 1;
      len._4_4_ = mbedtls_asn1_get_len(p,end,&stack0xffffffffffffffc8);
      if (len._4_4_ == 0) {
        len._4_4_ = x509_parse_int((uchar **)end_local,2,&pmStack_28->year);
        p_local._4_4_ = len._4_4_;
        if ((((len._4_4_ == 0) &&
             (len._4_4_ = x509_parse_int((uchar **)end_local,2,&pmStack_28->mon),
             p_local._4_4_ = len._4_4_, len._4_4_ == 0)) &&
            (len._4_4_ = x509_parse_int((uchar **)end_local,2,&pmStack_28->day),
            p_local._4_4_ = len._4_4_, len._4_4_ == 0)) &&
           (((len._4_4_ = x509_parse_int((uchar **)end_local,2,&pmStack_28->hour),
             p_local._4_4_ = len._4_4_, len._4_4_ == 0 &&
             (len._4_4_ = x509_parse_int((uchar **)end_local,2,&pmStack_28->min),
             p_local._4_4_ = len._4_4_, len._4_4_ == 0)) &&
            ((uStack_38 < 0xb ||
             (p_local._4_4_ = x509_parse_int((uchar **)end_local,2,&pmStack_28->sec),
             p_local._4_4_ == 0)))))) {
          if ((uStack_38 < 0xd) ||
             (pcVar1 = *(char **)end_local, *(char **)end_local = pcVar1 + 1, *pcVar1 == 'Z')) {
            pmStack_28->year = (uint)(pmStack_28->year < 0x32) * 100 + pmStack_28->year;
            pmStack_28->year = pmStack_28->year + 0x76c;
            p_local._4_4_ = 0;
          }
          else {
            p_local._4_4_ = -0x2400;
          }
        }
      }
      else {
        p_local._4_4_ = len._4_4_ + -0x2400;
      }
    }
    else if (**p == '\x18') {
      *p = *p + 1;
      len._4_4_ = mbedtls_asn1_get_len(p,end,&stack0xffffffffffffffc8);
      if (len._4_4_ == 0) {
        len._4_4_ = x509_parse_int((uchar **)end_local,4,&pmStack_28->year);
        p_local._4_4_ = len._4_4_;
        if (((((len._4_4_ == 0) &&
              (len._4_4_ = x509_parse_int((uchar **)end_local,2,&pmStack_28->mon),
              p_local._4_4_ = len._4_4_, len._4_4_ == 0)) &&
             (len._4_4_ = x509_parse_int((uchar **)end_local,2,&pmStack_28->day),
             p_local._4_4_ = len._4_4_, len._4_4_ == 0)) &&
            ((len._4_4_ = x509_parse_int((uchar **)end_local,2,&pmStack_28->hour),
             p_local._4_4_ = len._4_4_, len._4_4_ == 0 &&
             (len._4_4_ = x509_parse_int((uchar **)end_local,2,&pmStack_28->min),
             p_local._4_4_ = len._4_4_, len._4_4_ == 0)))) &&
           ((uStack_38 < 0xd ||
            (p_local._4_4_ = x509_parse_int((uchar **)end_local,2,&pmStack_28->sec),
            p_local._4_4_ == 0)))) {
          if ((uStack_38 < 0xf) ||
             (pcVar1 = *(char **)end_local, *(char **)end_local = pcVar1 + 1, *pcVar1 == 'Z')) {
            p_local._4_4_ = 0;
          }
          else {
            p_local._4_4_ = -0x2400;
          }
        }
      }
      else {
        p_local._4_4_ = len._4_4_ + -0x2400;
      }
    }
    else {
      p_local._4_4_ = -0x2462;
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_x509_get_time( unsigned char **p, const unsigned char *end,
                   mbedtls_x509_time *time )
{
    int ret;
    size_t len;
    unsigned char tag;

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    tag = **p;

    if( tag == MBEDTLS_ASN1_UTC_TIME )
    {
        (*p)++;
        ret = mbedtls_asn1_get_len( p, end, &len );

        if( ret != 0 )
            return( MBEDTLS_ERR_X509_INVALID_DATE + ret );

        CHECK( x509_parse_int( p, 2, &time->year ) );
        CHECK( x509_parse_int( p, 2, &time->mon ) );
        CHECK( x509_parse_int( p, 2, &time->day ) );
        CHECK( x509_parse_int( p, 2, &time->hour ) );
        CHECK( x509_parse_int( p, 2, &time->min ) );
        if( len > 10 )
            CHECK( x509_parse_int( p, 2, &time->sec ) );
        if( len > 12 && *(*p)++ != 'Z' )
            return( MBEDTLS_ERR_X509_INVALID_DATE );

        time->year +=  100 * ( time->year < 50 );
        time->year += 1900;

        return( 0 );
    }
    else if( tag == MBEDTLS_ASN1_GENERALIZED_TIME )
    {
        (*p)++;
        ret = mbedtls_asn1_get_len( p, end, &len );

        if( ret != 0 )
            return( MBEDTLS_ERR_X509_INVALID_DATE + ret );

        CHECK( x509_parse_int( p, 4, &time->year ) );
        CHECK( x509_parse_int( p, 2, &time->mon ) );
        CHECK( x509_parse_int( p, 2, &time->day ) );
        CHECK( x509_parse_int( p, 2, &time->hour ) );
        CHECK( x509_parse_int( p, 2, &time->min ) );
        if( len > 12 )
            CHECK( x509_parse_int( p, 2, &time->sec ) );
        if( len > 14 && *(*p)++ != 'Z' )
            return( MBEDTLS_ERR_X509_INVALID_DATE );

        return( 0 );
    }
    else
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );
}